

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

acCode readAC(FILE *f,uchar number)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  uint uVar7;
  uint uVar8;
  
  uVar8 = 1;
  bVar1 = matchHuff(f,number,'\x01');
  uVar4 = (ulong)bVar1;
  uVar5 = uVar4;
  uVar6 = uVar4;
  if (bVar1 != 0) {
    if (bVar1 == 0xf0) {
      uVar4 = 0;
      uVar5 = 0x1000;
      uVar6 = 0;
    }
    else {
      bVar2 = getBit(f);
      for (uVar7 = 1; uVar7 < (bVar1 & 0xf); uVar7 = uVar7 + 1) {
        bVar3 = getBit(f);
        uVar8 = (uint)(bVar3 == bVar2) + uVar8 * 2;
      }
      uVar7 = -uVar8;
      if (bVar2) {
        uVar7 = uVar8;
      }
      uVar4 = (ulong)uVar7 << 0x20;
      uVar5 = (ulong)(bVar1 >> 4) << 8;
      uVar6 = (ulong)(bVar1 & 0xf);
    }
  }
  return (acCode)(uVar6 | uVar5 | uVar4);
}

Assistant:

acCode readAC(FILE *f, unsigned char number) {
    unsigned char x = matchHuff(f, number, AC);
    unsigned char zeros = x >> 4;
    unsigned char codeLen = x & 0x0F;
    if (x == 0) {
        return acCode{0,0,0};
    } else if (x == 0xF0) {
        return acCode{0, 16, 0};
    }
    unsigned  char first = getBit(f);
    int code = 1;
    for (int i = 1; i < codeLen; i++) {
        unsigned char b = getBit(f);
        code = code << 1;
        code += first ? b : !b;
    }
    code = first ? code : -code;
//    printf("read AC: %d %d %d\n", codeLen, zeros, code);
    return acCode{codeLen, zeros, code};
}